

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

void ggml_quantize_mat_t<8l,(ggml_type)15>(float *x,void *vy,int64_t nrow,int64_t n_per_row)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  uint uVar13;
  float *pfVar14;
  int k;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  float *pfVar20;
  undefined1 *puVar21;
  bool bVar22;
  undefined8 uVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar36 [32];
  undefined4 uVar37;
  undefined1 auVar38 [32];
  undefined1 in_ZMM20 [64];
  __m256 iscale_vec [4];
  __m256 srcv [4] [32];
  float local_14e0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 auStack_1460 [32];
  undefined1 auStack_1440 [32];
  undefined1 auStack_1420 [32];
  undefined1 auStack_1400 [32];
  undefined1 auStack_13e0 [32];
  undefined1 auStack_13c0 [32];
  undefined1 auStack_13a0 [32];
  undefined1 auStack_1380 [800];
  float local_1060 [8];
  undefined1 auStack_1040 [32];
  undefined1 auStack_1020 [32];
  undefined1 auStack_1000 [128];
  undefined1 local_f80 [800];
  float afStack_c60 [256];
  undefined1 auStack_860 [1024];
  undefined1 auStack_460 [1072];
  
  lVar18 = n_per_row + 0xff;
  if (-1 < n_per_row) {
    lVar18 = n_per_row;
  }
  uVar13 = (uint)((ulong)lVar18 >> 8);
  if (0 < (int)uVar13) {
    pfVar14 = x + 0x38;
    lVar18 = (long)vy + 0x10;
    uVar19 = 0;
    auVar35._8_4_ = 0x7fffffff;
    auVar35._0_8_ = 0x7fffffff7fffffff;
    auVar35._12_4_ = 0x7fffffff;
    auVar35._16_4_ = 0x7fffffff;
    auVar35._20_4_ = 0x7fffffff;
    auVar35._24_4_ = 0x7fffffff;
    auVar35._28_4_ = 0x7fffffff;
    auVar3 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar25 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
    auVar5 = vpmovsxbd_avx2(ZEXT816(0x703060205010400));
    auVar6 = vpmovsxbd_avx2(ZEXT816(0xe060c040a020800));
    auVar4 = vpmovsxbw_avx2(_DAT_0016b390);
    auVar36[8] = 1;
    auVar36._0_8_ = 0x101010101010101;
    auVar36[9] = 1;
    auVar36[10] = 1;
    auVar36[0xb] = 1;
    auVar36[0xc] = 1;
    auVar36[0xd] = 1;
    auVar36[0xe] = 1;
    auVar36[0xf] = 1;
    auVar36[0x10] = 1;
    auVar36[0x11] = 1;
    auVar36[0x12] = 1;
    auVar36[0x13] = 1;
    auVar36[0x14] = 1;
    auVar36[0x15] = 1;
    auVar36[0x16] = 1;
    auVar36[0x17] = 1;
    auVar36[0x18] = 1;
    auVar36[0x19] = 1;
    auVar36[0x1a] = 1;
    auVar36[0x1b] = 1;
    auVar36[0x1c] = 1;
    auVar36[0x1d] = 1;
    auVar36[0x1e] = 1;
    auVar36[0x1f] = 1;
    do {
      lVar17 = 0;
      pfVar20 = pfVar14;
      puVar21 = local_f80;
      do {
        lVar16 = lVar17 * n_per_row;
        auVar38 = *(undefined1 (*) [32])(x + uVar19 * 0x100 + lVar16);
        auVar31 = *(undefined1 (*) [32])(x + uVar19 * 0x100 + lVar16 + 8);
        auVar29 = *(undefined1 (*) [32])(x + uVar19 * 0x100 + lVar16 + 0x10);
        auVar30 = *(undefined1 (*) [32])(x + uVar19 * 0x100 + lVar16 + 0x18);
        auVar27 = vandps_avx(auVar38,auVar35);
        auVar33 = vandps_avx(auVar31,auVar35);
        auVar33 = vmaxps_avx(auVar27,auVar33);
        auVar27 = vandps_avx(auVar29,auVar35);
        auVar33 = vmaxps_avx(auVar33,auVar27);
        auVar27 = vandps_avx(auVar30,auVar35);
        auVar27 = vmaxps_avx(auVar33,auVar27);
        uVar7 = vcmpps_avx512vl(auVar27,auVar38,0);
        uVar23 = vcmpps_avx512vl(auVar27,auVar31,0);
        uVar8 = vcmpps_avx512vl(auVar27,auVar29,0);
        uVar9 = vcmpps_avx512vl(auVar27,auVar30,0);
        auVar33 = vpmovm2d_avx512vl((ulong)(byte)((byte)uVar7 | (byte)uVar23 |
                                                 (byte)uVar9 | (byte)uVar8));
        lVar16 = lVar17 * 0x400;
        *(undefined1 (*) [32])(local_1060 + lVar17 * 0x100) = auVar38;
        *(undefined1 (*) [32])(auStack_1040 + lVar16) = auVar31;
        *(undefined1 (*) [32])(auStack_1020 + lVar16) = auVar29;
        *(undefined1 (*) [32])(auStack_1000 + lVar16) = auVar30;
        lVar16 = 0;
        do {
          auVar38 = *(undefined1 (*) [32])((long)pfVar20 + lVar16 + -0x60);
          auVar31 = *(undefined1 (*) [32])((long)pfVar20 + lVar16 + -0x40);
          auVar29 = *(undefined1 (*) [32])((long)pfVar20 + lVar16 + -0x20);
          auVar30 = *(undefined1 (*) [32])((long)pfVar20 + lVar16);
          auVar26 = vandps_avx(auVar38,auVar35);
          vandps_avx512vl(auVar31,auVar35);
          vandps_avx512vl(auVar29,auVar35);
          vandps_avx512vl(auVar30,auVar35);
          auVar26 = vmaxps_avx(auVar27,auVar26);
          auVar26 = vmaxps_avx512vl(auVar26,auVar30);
          auVar26 = vmaxps_avx512vl(auVar26,auVar30);
          auVar26 = vmaxps_avx512vl(auVar26,auVar30);
          uVar10 = vcmpps_avx512vl(auVar27,auVar26,0);
          auVar27 = vmovdqa32_avx512vl(auVar33);
          uVar7 = vcmpps_avx512vl(auVar26,auVar38,0);
          uVar23 = vcmpps_avx512vl(auVar26,auVar31,0);
          uVar8 = vcmpps_avx512vl(auVar26,auVar29,0);
          uVar9 = vcmpps_avx512vl(auVar26,auVar30,0);
          bVar11 = (byte)uVar7 | (byte)uVar23 | (byte)uVar9 | (byte)uVar8;
          auVar28 = vmovdqa32_avx512vl(auVar3);
          auVar33._0_4_ =
               (uint)(bVar11 & 1) * auVar28._0_4_ |
               (uint)!(bool)(bVar11 & 1) * (uint)((byte)uVar10 & 1) * auVar27._0_4_;
          bVar12 = (bool)(bVar11 >> 1 & 1);
          auVar33._4_4_ =
               (uint)bVar12 * auVar28._4_4_ |
               (uint)!bVar12 * (uint)((byte)(uVar10 >> 1) & 1) * auVar27._4_4_;
          bVar12 = (bool)(bVar11 >> 2 & 1);
          auVar33._8_4_ =
               (uint)bVar12 * auVar28._8_4_ |
               (uint)!bVar12 * (uint)((byte)(uVar10 >> 2) & 1) * auVar27._8_4_;
          bVar12 = (bool)(bVar11 >> 3 & 1);
          auVar33._12_4_ =
               (uint)bVar12 * auVar28._12_4_ |
               (uint)!bVar12 * (uint)((byte)(uVar10 >> 3) & 1) * auVar27._12_4_;
          bVar12 = (bool)(bVar11 >> 4 & 1);
          auVar33._16_4_ =
               (uint)bVar12 * auVar28._16_4_ |
               (uint)!bVar12 * (uint)((byte)(uVar10 >> 4) & 1) * auVar27._16_4_;
          bVar12 = (bool)(bVar11 >> 5 & 1);
          auVar33._20_4_ =
               (uint)bVar12 * auVar28._20_4_ |
               (uint)!bVar12 * (uint)((byte)(uVar10 >> 5) & 1) * auVar27._20_4_;
          bVar12 = (bool)(bVar11 >> 6 & 1);
          auVar33._24_4_ =
               (uint)bVar12 * auVar28._24_4_ |
               (uint)!bVar12 * (uint)((byte)(uVar10 >> 6) & 1) * auVar27._24_4_;
          auVar33._28_4_ =
               (uint)(bVar11 >> 7) * auVar28._28_4_ |
               (uint)!(bool)(bVar11 >> 7) * (uint)(byte)(uVar10 >> 7) * auVar27._28_4_;
          *(undefined1 (*) [32])(puVar21 + lVar16 + -0x60) = auVar38;
          *(undefined1 (*) [32])(puVar21 + lVar16 + -0x40) = auVar31;
          *(undefined1 (*) [32])(puVar21 + lVar16 + -0x20) = auVar29;
          *(undefined1 (*) [32])(puVar21 + lVar16) = auVar30;
          uVar10 = lVar16 - 0x300;
          lVar16 = lVar16 + 0x80;
          auVar27 = auVar26;
        } while (uVar10 != 0);
        auVar1 = vmaxps_avx(auVar26._16_16_,auVar26._0_16_);
        auVar2 = vshufpd_avx(auVar1,auVar1,3);
        auVar1 = vmaxps_avx(auVar1,auVar2);
        auVar2 = vmovshdup_avx(auVar1);
        auVar1 = vmaxss_avx(auVar1,auVar2);
        uVar37 = auVar1._0_4_;
        auVar38._4_4_ = uVar37;
        auVar38._0_4_ = uVar37;
        auVar38._8_4_ = uVar37;
        auVar38._12_4_ = uVar37;
        auVar38._16_4_ = uVar37;
        auVar38._20_4_ = uVar37;
        auVar38._24_4_ = uVar37;
        auVar38._28_4_ = uVar37;
        uVar7 = vcmpps_avx512vl(auVar38,auVar26,0);
        auVar1 = vucomiss_avx512f(auVar25);
        uVar23 = vpmovd2m_avx512vl(auVar33);
        bVar12 = uVar10 != 0 || POPCOUNT(uVar10 & 0xff) == '\0';
        bVar22 = (byte)((byte)uVar7 & (byte)uVar23) == 0;
        fVar24 = (float)((uint)bVar22 * (uint)bVar12 * (int)(127.0 / auVar1._0_4_) +
                        (uint)!bVar22 * (uint)bVar12 * (int)(-127.0 / auVar1._0_4_));
        *(uint *)((long)vy + lVar17 * 4 + uVar19 * 0x490) = (uint)bVar12 * (int)(1.0 / fVar24);
        local_14e0[lVar17 * 8] = fVar24;
        local_14e0[lVar17 * 8 + 1] = fVar24;
        local_14e0[lVar17 * 8 + 2] = fVar24;
        local_14e0[lVar17 * 8 + 3] = fVar24;
        local_14e0[lVar17 * 8 + 4] = fVar24;
        local_14e0[lVar17 * 8 + 5] = fVar24;
        local_14e0[lVar17 * 8 + 6] = fVar24;
        local_14e0[lVar17 * 8 + 7] = fVar24;
        lVar17 = lVar17 + 1;
        puVar21 = puVar21 + 0x400;
        pfVar20 = pfVar20 + n_per_row;
      } while (lVar17 != 4);
      lVar17 = 0;
      do {
        auVar30._4_4_ = local_14e0[1] * *(float *)((long)local_1060 + lVar17 + 4);
        auVar30._0_4_ = local_14e0[0] * *(float *)((long)local_1060 + lVar17);
        auVar30._8_4_ = local_14e0[2] * *(float *)((long)local_1060 + lVar17 + 8);
        auVar30._12_4_ = local_14e0[3] * *(float *)((long)local_1060 + lVar17 + 0xc);
        auVar30._16_4_ = local_14e0[4] * *(float *)((long)local_1060 + lVar17 + 0x10);
        auVar30._20_4_ = local_14e0[5] * *(float *)((long)local_1060 + lVar17 + 0x14);
        auVar30._24_4_ = local_14e0[6] * *(float *)((long)local_1060 + lVar17 + 0x18);
        auVar30._28_4_ = auVar31._28_4_;
        auVar31._4_4_ = local_14e0[9] * *(float *)((long)afStack_c60 + lVar17 + 4);
        auVar31._0_4_ = local_14e0[8] * *(float *)((long)afStack_c60 + lVar17);
        auVar31._8_4_ = local_14e0[10] * *(float *)((long)afStack_c60 + lVar17 + 8);
        auVar31._12_4_ = local_14e0[0xb] * *(float *)((long)afStack_c60 + lVar17 + 0xc);
        auVar31._16_4_ = local_14e0[0xc] * *(float *)((long)afStack_c60 + lVar17 + 0x10);
        auVar31._20_4_ = local_14e0[0xd] * *(float *)((long)afStack_c60 + lVar17 + 0x14);
        auVar31._24_4_ = local_14e0[0xe] * *(float *)((long)afStack_c60 + lVar17 + 0x18);
        auVar31._28_4_ = auVar29._28_4_;
        auVar29 = vmulps_avx512vl(local_14a0,*(undefined1 (*) [32])(auStack_860 + lVar17));
        auVar27 = vmulps_avx512vl(local_1480,*(undefined1 (*) [32])(auStack_460 + lVar17));
        auVar38 = vroundps_avx(auVar30,0);
        auVar31 = vroundps_avx(auVar31,0);
        auVar29 = vrndscaleps_avx512vl(auVar29,0);
        auVar30 = vrndscaleps_avx512vl(auVar27,0);
        auVar38 = vcvtps2dq_avx(auVar38);
        auVar31 = vcvtps2dq_avx(auVar31);
        auVar38 = vpackssdw_avx2(auVar38,auVar31);
        auVar31 = vcvtps2dq_avx512vl(auVar29);
        auVar29 = vcvtps2dq_avx512vl(auVar30);
        auVar29 = vpackssdw_avx512vl(auVar31,auVar29);
        auVar38 = vpacksswb_avx2(auVar38,auVar29);
        auVar31 = vpermd_avx2(auVar5,auVar38);
        *(undefined1 (*) [32])(lVar18 + lVar17) = auVar31;
        *(undefined1 (*) [32])(auStack_1460 + lVar17) = auVar31;
        lVar17 = lVar17 + 0x20;
      } while (lVar17 != 0x400);
      lVar17 = 0;
      do {
        lVar16 = lVar17 * 0x100;
        auVar38 = *(undefined1 (*) [32])(auStack_1460 + lVar16);
        auVar31 = *(undefined1 (*) [32])(auStack_1440 + lVar16);
        auVar28 = vmovdqa64_avx512vl(*(undefined1 (*) [32])(auStack_1420 + lVar16));
        auVar29 = *(undefined1 (*) [32])(auStack_1400 + lVar16);
        auVar32 = vmovdqa64_avx512vl(*(undefined1 (*) [32])(auStack_13e0 + lVar16));
        auVar30 = *(undefined1 (*) [32])(auStack_13c0 + lVar16);
        auVar26 = vmovdqa64_avx512vl(*(undefined1 (*) [32])(auStack_13a0 + lVar16));
        auVar27 = *(undefined1 (*) [32])(auStack_1380 + lVar16);
        auVar33 = vpslld_avx512vl(auVar28,0x10);
        auVar33 = vpblendw_avx2(auVar38,auVar33,0x22);
        auVar33 = vpermt2d_avx512vl(auVar33,auVar6,auVar32);
        auVar33 = vpermt2w_avx512vl(auVar33,auVar4,auVar26);
        auVar33 = vpmaddubsw_avx2(auVar36,auVar33);
        iVar15 = 3;
        do {
          auVar38 = vpsrlq_avx2(auVar38,0x10);
          auVar28 = vpsrlq_avx512vl(auVar28,0x10);
          auVar32 = vpsrlq_avx512vl(auVar32,0x10);
          auVar26 = vpsrlq_avx512vl(auVar26,0x10);
          auVar34 = vpslld_avx512vl(auVar28,0x10);
          auVar34 = vpblendw_avx2(auVar38,auVar34,0x22);
          auVar34 = vpermt2d_avx512vl(auVar34,auVar6,auVar32);
          auVar34 = vpermt2w_avx512vl(auVar34,auVar4,auVar26);
          auVar34 = vpmaddubsw_avx2(auVar36,auVar34);
          auVar33 = vpaddw_avx2(auVar33,auVar34);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        auVar38 = vpslld_avx2(auVar29,0x10);
        auVar38 = vpblendw_avx2(auVar31,auVar38,0x22);
        auVar38 = vpermt2d_avx512vl(auVar38,auVar6,auVar30);
        auVar38 = vpermt2w_avx512vl(auVar38,auVar4,auVar27);
        auVar38 = vpmaddubsw_avx2(auVar36,auVar38);
        iVar15 = 3;
        do {
          auVar31 = vpsrlq_avx2(auVar31,0x10);
          auVar29 = vpsrlq_avx2(auVar29,0x10);
          auVar30 = vpsrlq_avx2(auVar30,0x10);
          auVar27 = vpsrlq_avx2(auVar27,0x10);
          auVar26 = vpslld_avx2(auVar29,0x10);
          auVar26 = vpblendw_avx2(auVar31,auVar26,0x22);
          auVar26 = vpermt2d_avx512vl(auVar26,auVar6,auVar30);
          auVar26 = vpermt2w_avx512vl(auVar26,auVar4,auVar27);
          auVar26 = vpmaddubsw_avx2(auVar36,auVar26);
          auVar38 = vpaddw_avx2(auVar38,auVar26);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        auVar38 = vpaddw_avx2(auVar38,auVar33);
        *(undefined1 (*) [32])((long)vy + lVar17 * 0x20 + uVar19 * 0x490 + 0x410) = auVar38;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 4);
      uVar19 = uVar19 + 1;
      pfVar14 = pfVar14 + 0x100;
      lVar18 = lVar18 + 0x490;
    } while (uVar19 != (uVar13 & 0x7fffffff));
  }
  return;
}

Assistant:

void ggml_quantize_mat_t<8, GGML_TYPE_Q8_K>(const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t nrow, int64_t n_per_row) {
    assert(nrow == 4);
    UNUSED(nrow);
    ggml_quantize_mat_q8_K_4x8(x, vy, n_per_row);
}